

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
push_token(jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *tok,static_resources *resources,
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *output_stack,error_code *ec)

{
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  token_kind tVar4;
  reference ptVar5;
  undefined8 uVar6;
  reference pvVar7;
  unsigned_long *puVar8;
  size_t sVar9;
  size_t sVar10;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *peVar11;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *this_00;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this_01;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI;
  long in_RDI;
  optional<unsigned_long> oVar12;
  reverse_iterator it_6;
  reverse_iterator it_5;
  size_t arg_count;
  reverse_iterator it_4;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  toks_4;
  reverse_iterator it_3;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  toks_3;
  type key;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  toks_2;
  reverse_iterator it_2;
  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
  key_toks;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  toks_1;
  reverse_iterator it_1;
  vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  vals;
  reverse_iterator it;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  toks;
  value_type *in_stack_fffffffffffff208;
  filter_expression *in_stack_fffffffffffff210;
  __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffff218;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *__args;
  __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffff220;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff228;
  const_iterator in_stack_fffffffffffff230;
  const_iterator in_stack_fffffffffffff238;
  allocator<char> *in_stack_fffffffffffff240;
  char *in_stack_fffffffffffff248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff250;
  filter_expression *in_stack_fffffffffffff258;
  static_resources *in_stack_fffffffffffff260;
  bool local_d81;
  bool local_d72;
  bool local_d71;
  error_code *in_stack_fffffffffffff2c0;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff2c8;
  unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *puVar13;
  jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff2d0;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> local_848 [5];
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_710;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_708;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_6f8;
  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  local_6e0 [22];
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_630;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_628;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_618;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_608;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_600;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_590;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_588;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_578;
  _Storage<unsigned_long,_true> local_568;
  undefined1 local_560;
  _Storage<unsigned_long,_true> local_558;
  undefined1 local_550;
  unsigned_long local_538;
  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  local_530 [17];
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_4a8;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_4a0;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_490;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_480;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_478;
  undefined1 local_46a;
  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  local_438 [23];
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_380;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_378;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_368;
  key_tokens *local_358;
  key_tokens *local_350;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_340;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_338;
  string local_330 [38];
  undefined1 local_30a;
  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  local_2c0 [23];
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_208;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_200;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_1f8;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_1f0;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_1e0;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_1c8;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_1c0;
  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  local_190 [29];
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_a8;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_a0;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_90;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_80;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_78;
  undefined4 local_6c;
  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  local_48 [7];
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_10;
  
  local_10 = in_RSI;
  tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::type
                    (in_RSI);
  switch(tVar4) {
  case current_node:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    break;
  case lparen:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
    break;
  case rparen:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    break;
  case begin_multi_select_hash:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    this_00 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)(in_RDI + 0x28);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token();
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              (this_00,in_stack_fffffffffffff218._M_current);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )in_stack_fffffffffffff210);
    break;
  case end_multi_select_hash:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    std::
    vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ::vector((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
              *)0x4b5a01);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
    while( true ) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff208);
      bVar3 = false;
      if (bVar2) {
        ptVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffff210);
        tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                type(ptVar5);
        bVar3 = tVar4 != begin_multi_select_hash;
      }
      if (!bVar3) break;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)0x4b5ac6);
      do {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffff210);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff210);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff218._M_current);
        bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                 *)in_stack_fffffffffffff210,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                 *)in_stack_fffffffffffff208);
        bVar3 = false;
        if (bVar2) {
          ptVar5 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                *)in_stack_fffffffffffff210);
          tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::type(ptVar5);
          bVar3 = tVar4 != key;
        }
      } while (bVar3);
      ptVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff210);
      bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              is_key(ptVar5);
      if (!bVar3) {
        local_30a = 1;
        uVar6 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff250,in_stack_fffffffffffff248,in_stack_fffffffffffff240);
        assertion_error::assertion_error
                  ((assertion_error *)in_stack_fffffffffffff210,(string *)in_stack_fffffffffffff208)
        ;
        local_30a = 0;
        __cxa_throw(uVar6,&assertion_error::typeinfo,assertion_error::~assertion_error);
      }
      ptVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff210);
      std::__cxx11::string::string(local_330,(string *)&ptVar5->key_);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
      ptVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(ptVar5);
      if (tVar4 == separator) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff210);
      }
      pvVar7 = std::
               vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(pvVar7);
      if (tVar4 != literal) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,
                   (current_node_arg_t *)in_stack_fffffffffffff218._M_current);
      }
      local_338 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::begin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff208);
      local_340 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff208);
      std::
      reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
      std::
      vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens>>
      ::
      emplace_back<std::__cxx11::string,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                ((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                  *)in_stack_fffffffffffff220._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff218._M_current,
                 (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
      std::__cxx11::string::~string(local_330);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff220._M_current);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff218._M_current);
    bVar3 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff220._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff218._M_current);
    if (bVar3) {
      std::error_code::operator=
                ((error_code *)in_stack_fffffffffffff220._M_current,
                 (jmespath_errc)((ulong)in_stack_fffffffffffff218._M_current >> 0x20));
      local_6c = 1;
    }
    else {
      local_350 = (key_tokens *)
                  std::
                  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                  ::begin((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                           *)in_stack_fffffffffffff208);
      local_358 = (key_tokens *)
                  std::
                  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                  ::end((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                         *)in_stack_fffffffffffff208);
      std::
      reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens*,std::vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens>>>>
                ((__normal_iterator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens_*,_std::vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>_>
                  )in_stack_fffffffffffff220._M_current,
                 (__normal_iterator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens_*,_std::vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>_>
                  )in_stack_fffffffffffff218._M_current);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
      local_368 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     ::base(local_2c0);
      __gnu_cxx::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff210,
                 (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff208);
      local_378 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff208);
      __gnu_cxx::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff210,
                 (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff208);
      local_380 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                             in_stack_fffffffffffff230);
      bVar3 = std::
              vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff220._M_current);
      if (bVar3) {
LAB_004b61b1:
        multi_select_hash::multi_select_hash
                  ((multi_select_hash *)in_stack_fffffffffffff210,
                   (vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                    *)in_stack_fffffffffffff208);
        jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
        ::static_resources::
        create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_hash>
                  (in_stack_fffffffffffff260,(multi_select_hash *)in_stack_fffffffffffff258);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210,
                   (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff208);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210);
        multi_select_hash::~multi_select_hash((multi_select_hash *)in_stack_fffffffffffff210);
      }
      else {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_projection((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffff258);
        if (!bVar3) goto LAB_004b61b1;
        sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(in_stack_fffffffffffff2c8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::precedence_level(in_stack_fffffffffffff2c8);
        if (sVar10 <= sVar9) {
          sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(in_stack_fffffffffffff2c8);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
          sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::precedence_level(in_stack_fffffffffffff2c8);
          if ((sVar9 != sVar10) ||
             (bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::is_right_associative(in_stack_fffffffffffff2c8), !bVar3)) goto LAB_004b61b1;
        }
        pvVar7 = std::
                 vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff210);
        puVar13 = (pvVar7->field_2).unary_operator_;
        multi_select_hash::multi_select_hash
                  ((multi_select_hash *)in_stack_fffffffffffff210,
                   (vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                    *)in_stack_fffffffffffff208);
        peVar11 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ::static_resources::
                  create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_hash>
                            (in_stack_fffffffffffff260,
                             (multi_select_hash *)in_stack_fffffffffffff258);
        (*puVar13->_vptr_unary_operator[3])(puVar13,peVar11);
        multi_select_hash::~multi_select_hash((multi_select_hash *)in_stack_fffffffffffff210);
      }
      local_6c = 2;
    }
    std::
    vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ::~vector((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               *)in_stack_fffffffffffff220._M_current);
    break;
  case begin_multi_select_list:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token();
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )in_stack_fffffffffffff210);
    break;
  case end_multi_select_list:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    std::
    vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
    ::vector((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
              *)0x4b5276);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
    while( true ) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff208);
      bVar3 = false;
      if (bVar2) {
        ptVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffff210);
        tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                type(ptVar5);
        bVar3 = tVar4 != begin_multi_select_list;
      }
      if (!bVar3) break;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)0x4b533b);
      do {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffff210);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff210);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff218._M_current);
        bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                 *)in_stack_fffffffffffff210,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                 *)in_stack_fffffffffffff208);
        bVar3 = false;
        if (bVar2) {
          ptVar5 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                *)in_stack_fffffffffffff210);
          tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::type(ptVar5);
          bVar3 = false;
          if (tVar4 != begin_multi_select_list) {
            ptVar5 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                  *)in_stack_fffffffffffff210);
            tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::type(ptVar5);
            bVar3 = tVar4 != separator;
          }
        }
      } while (bVar3);
      ptVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(ptVar5);
      if (tVar4 == separator) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff210);
      }
      pvVar7 = std::
               vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(pvVar7);
      if (tVar4 != literal) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,
                   (current_node_arg_t *)in_stack_fffffffffffff218._M_current);
      }
      local_1c0 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::begin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff208);
      local_1c8 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff208);
      std::
      reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
      std::
      vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
      ::
      emplace_back<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                ((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff220._M_current,
                 (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff218._M_current);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff220._M_current);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff218._M_current);
    bVar3 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff220._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff218._M_current);
    if (bVar3) {
      std::error_code::operator=
                ((error_code *)in_stack_fffffffffffff220._M_current,
                 (jmespath_errc)((ulong)in_stack_fffffffffffff218._M_current >> 0x20));
      local_6c = 1;
    }
    else {
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
      local_1e0 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     ::base(local_190);
      __gnu_cxx::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff210,
                 (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff208);
      local_1f0 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff208);
      __gnu_cxx::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff210,
                 (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff208);
      local_1f8 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)std::
                     vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                             in_stack_fffffffffffff230);
      local_200 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)std::
                     vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     ::begin((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffff208);
      local_208 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)std::
                     vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     ::end((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff208);
      std::
      reverse<__gnu_cxx::__normal_iterator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>*,std::vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>>>
                ((__normal_iterator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_*,_std::vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>_>
                  )in_stack_fffffffffffff220._M_current,
                 (__normal_iterator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_*,_std::vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>_>
                  )in_stack_fffffffffffff218._M_current);
      bVar3 = std::
              vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff220._M_current);
      if (bVar3) {
LAB_004b58c2:
        multi_select_list::multi_select_list
                  ((multi_select_list *)in_stack_fffffffffffff210,
                   (vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
        ::static_resources::
        create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_list>
                  (in_stack_fffffffffffff260,(multi_select_list *)in_stack_fffffffffffff258);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210,
                   (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff208);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210);
        multi_select_list::~multi_select_list((multi_select_list *)in_stack_fffffffffffff210);
      }
      else {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_projection((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffff258);
        if (!bVar3) goto LAB_004b58c2;
        sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(in_stack_fffffffffffff2c8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::precedence_level(in_stack_fffffffffffff2c8);
        if (sVar10 <= sVar9) {
          sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(in_stack_fffffffffffff2c8);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
          sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::precedence_level(in_stack_fffffffffffff2c8);
          if ((sVar9 != sVar10) ||
             (bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::is_right_associative(in_stack_fffffffffffff2c8), !bVar3)) goto LAB_004b58c2;
        }
        pvVar7 = std::
                 vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff210);
        puVar13 = (pvVar7->field_2).unary_operator_;
        multi_select_list::multi_select_list
                  ((multi_select_list *)in_stack_fffffffffffff210,
                   (vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        peVar11 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ::static_resources::
                  create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_list>
                            (in_stack_fffffffffffff260,
                             (multi_select_list *)in_stack_fffffffffffff258);
        (*puVar13->_vptr_unary_operator[3])(puVar13,peVar11);
        multi_select_list::~multi_select_list((multi_select_list *)in_stack_fffffffffffff210);
      }
      local_6c = 2;
    }
    std::
    vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               *)in_stack_fffffffffffff220._M_current);
    break;
  case begin_filter:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token();
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )in_stack_fffffffffffff210);
    break;
  case end_filter:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)0x4b4cc1);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
    while( true ) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff208);
      bVar3 = false;
      if (bVar2) {
        ptVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffff210);
        tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                type(ptVar5);
        bVar3 = tVar4 != begin_filter;
      }
      if (!bVar3) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffff210);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff218._M_current);
    bVar3 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff220._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff218._M_current);
    if (bVar3) {
      std::error_code::operator=
                ((error_code *)in_stack_fffffffffffff220._M_current,
                 (jmespath_errc)((ulong)in_stack_fffffffffffff218._M_current >> 0x20));
      local_6c = 1;
    }
    else {
      pvVar7 = std::
               vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(pvVar7);
      if (tVar4 != literal) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,
                   (current_node_arg_t *)in_stack_fffffffffffff218._M_current);
      }
      local_78 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)std::
                    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ::begin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff208);
      local_80 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)std::
                    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff208);
      std::
      reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
      local_90 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    ::base(local_48);
      __gnu_cxx::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff210,
                 (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff208);
      local_a0 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)std::
                    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff208);
      __gnu_cxx::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff210,
                 (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff208);
      local_a8 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)std::
                    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                            in_stack_fffffffffffff230);
      bVar3 = std::
              vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff220._M_current);
      if (bVar3) {
LAB_004b5137:
        filter_expression::filter_expression
                  (in_stack_fffffffffffff210,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
        ::static_resources::
        create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
                  (in_stack_fffffffffffff260,in_stack_fffffffffffff258);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210,
                   (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff208);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210);
        filter_expression::~filter_expression(in_stack_fffffffffffff210);
      }
      else {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_projection((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffff258);
        if (!bVar3) goto LAB_004b5137;
        sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(in_stack_fffffffffffff2c8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::precedence_level(in_stack_fffffffffffff2c8);
        if (sVar10 <= sVar9) {
          sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(in_stack_fffffffffffff2c8);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
          sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::precedence_level(in_stack_fffffffffffff2c8);
          if ((sVar9 != sVar10) ||
             (bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::is_right_associative(in_stack_fffffffffffff2c8), !bVar3)) goto LAB_004b5137;
        }
        pvVar7 = std::
                 vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff210);
        puVar13 = (pvVar7->field_2).unary_operator_;
        filter_expression::filter_expression
                  (in_stack_fffffffffffff210,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        peVar11 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ::static_resources::
                  create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
                            (in_stack_fffffffffffff260,in_stack_fffffffffffff258);
        (*puVar13->_vptr_unary_operator[3])(puVar13,peVar11);
        filter_expression::~filter_expression(in_stack_fffffffffffff210);
      }
      local_6c = 2;
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffff220._M_current);
    break;
  case pipe:
  case key:
  case begin_expression_type:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    break;
  case separator:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token();
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )in_stack_fffffffffffff210);
    break;
  case literal:
    bVar3 = std::
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff220._M_current);
    if (!bVar3) {
      pvVar7 = std::
               vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(pvVar7);
      if (tVar4 == current_node) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
        operator=((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        return;
      }
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    break;
  case expression:
    bVar3 = std::
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff220._M_current);
    if (!bVar3) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff210);
      bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              is_projection((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff258);
      if (bVar3) {
        sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(in_stack_fffffffffffff2c8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::precedence_level(in_stack_fffffffffffff2c8);
        if (sVar9 < sVar10) {
LAB_004b68c5:
          pvVar7 = std::
                   vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff210);
          (*((pvVar7->field_2).unary_operator_)->_vptr_unary_operator[3])
                    ((pvVar7->field_2).unary_operator_,(local_10->field_2).expression_);
          return;
        }
        sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(in_stack_fffffffffffff2c8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::precedence_level(in_stack_fffffffffffff2c8);
        if ((sVar9 == sVar10) &&
           (bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::is_right_associative(in_stack_fffffffffffff2c8), bVar3)) goto LAB_004b68c5;
      }
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    break;
  case binary_operator:
  case unary_operator:
    bVar3 = std::
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff220._M_current);
    if (!bVar3) {
      pvVar7 = std::
               vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210);
      bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              is_lparen(pvVar7);
      if (!bVar3) {
        sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(in_stack_fffffffffffff2c8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff210);
        sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::precedence_level(in_stack_fffffffffffff2c8);
        if (sVar10 <= sVar9) {
          sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(in_stack_fffffffffffff2c8);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
          sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::precedence_level(in_stack_fffffffffffff2c8);
          if ((sVar9 != sVar10) ||
             (bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::is_right_associative(in_stack_fffffffffffff2c8), !bVar3)) {
            std::
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff218._M_current);
            while( true ) {
              std::
              vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff218._M_current);
              bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                       *)in_stack_fffffffffffff210,
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                       *)in_stack_fffffffffffff208);
              local_d71 = false;
              if (bVar3) {
                ptVar5 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                      *)in_stack_fffffffffffff210);
                bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        ::is_operator(ptVar5);
                local_d71 = false;
                if (bVar3) {
                  sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                          ::precedence_level(in_stack_fffffffffffff2c8);
                  std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210);
                  sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           ::precedence_level(in_stack_fffffffffffff2c8);
                  local_d72 = true;
                  if (sVar9 <= sVar10) {
                    sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                            ::precedence_level(in_stack_fffffffffffff2c8);
                    std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                                 *)in_stack_fffffffffffff210);
                    sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             ::precedence_level(in_stack_fffffffffffff2c8);
                    local_d81 = false;
                    if (sVar9 == sVar10) {
                      local_d81 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                  ::is_right_associative(in_stack_fffffffffffff2c8);
                    }
                    local_d72 = local_d81;
                  }
                  local_d71 = local_d72;
                }
              }
              if (local_d71 == false) break;
              std::
              reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                           *)in_stack_fffffffffffff210);
              std::
              vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
              std::
              reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
              ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff210);
            }
            local_6f8 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                         *)std::
                           reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                           ::base(local_6e0);
            __gnu_cxx::
            __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ::
            __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                      ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff210,
                       (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff208);
            local_708 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                         *)std::
                           vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffff208);
            __gnu_cxx::
            __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ::
            __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                      ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff210,
                       (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff208);
            local_710 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                         *)std::
                           vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                                   in_stack_fffffffffffff230);
            std::
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
            ::
            emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                      ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current)
            ;
            return;
          }
        }
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
        return;
      }
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
    break;
  case function:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    this_01 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
              (in_RDI + 0x28);
    __args = local_848;
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token();
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff220._M_current,__args);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              (this_01);
    break;
  case end_function:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)0x4b6950);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
    local_538 = 0;
    while( true ) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff208);
      bVar3 = false;
      if (bVar2) {
        ptVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffff210);
        tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                type(ptVar5);
        bVar3 = tVar4 != function;
      }
      if (!bVar3) break;
      ptVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff210);
      tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              type(ptVar5);
      if (tVar4 == argument) {
        local_538 = local_538 + 1;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffff210);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff218._M_current);
    bVar3 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff220._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff218._M_current);
    if (bVar3) {
      std::error_code::operator=
                ((error_code *)in_stack_fffffffffffff220._M_current,
                 (jmespath_errc)((ulong)in_stack_fffffffffffff218._M_current >> 0x20));
      local_6c = 1;
    }
    else {
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffff210);
      oVar12 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
               arity((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff210);
      local_558._M_value =
           oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      local_550 = oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged;
      bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x4b6b88);
      uVar1 = local_538;
      bVar3 = false;
      if (bVar2) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffff210);
        oVar12 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::arity((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff210);
        local_568._M_value =
             oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_560 = oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged;
        puVar8 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4b6c0d);
        bVar3 = uVar1 != *puVar8;
      }
      if (bVar3) {
        std::error_code::operator=
                  ((error_code *)in_stack_fffffffffffff220._M_current,
                   (jmespath_errc)((ulong)in_stack_fffffffffffff218._M_current >> 0x20));
        local_6c = 1;
      }
      else if (local_538 == 0) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffff210);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff210);
        local_578 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                       ::base(local_530);
        __gnu_cxx::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
        ::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                  ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff210,
                   (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        local_588 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff208);
        __gnu_cxx::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
        ::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                  ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff210,
                   (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        local_590 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                               in_stack_fffffffffffff230);
        function_expression::function_expression
                  ((function_expression *)in_stack_fffffffffffff210,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
        ::static_resources::
        create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
                  (in_stack_fffffffffffff260,(function_expression *)in_stack_fffffffffffff258);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210,
                   (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff208);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff210);
        function_expression::~function_expression((function_expression *)in_stack_fffffffffffff210);
        local_6c = 2;
      }
      else {
        pvVar7 = std::
                 vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff210);
        tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                type(pvVar7);
        if (tVar4 != literal) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff220._M_current,
                     (current_node_arg_t *)in_stack_fffffffffffff218._M_current);
        }
        local_600 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::begin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff208);
        local_608 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff208);
        std::
        reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                  (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffff210);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff210);
        local_618 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                       ::base(local_530);
        __gnu_cxx::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
        ::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                  ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff210,
                   (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        local_628 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff208);
        __gnu_cxx::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
        ::
        __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
                  ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff210,
                   (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffff208);
        local_630 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)std::
                       vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                               in_stack_fffffffffffff230);
        bVar3 = std::
                vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                ::empty((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff220._M_current);
        if (bVar3) {
LAB_004b716e:
          function_expression::function_expression
                    ((function_expression *)in_stack_fffffffffffff210,
                     (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff208);
          jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          ::static_resources::
          create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
                    (in_stack_fffffffffffff260,(function_expression *)in_stack_fffffffffffff258);
          token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token
                    ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff210,
                     (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff208);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
          token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                    ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff210);
          function_expression::~function_expression
                    ((function_expression *)in_stack_fffffffffffff210);
        }
        else {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
          bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::is_projection((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffff258);
          if (!bVar3) goto LAB_004b716e;
          sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(in_stack_fffffffffffff2c8);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff210);
          sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::precedence_level(in_stack_fffffffffffff2c8);
          if (sVar10 <= sVar9) {
            sVar9 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::precedence_level(in_stack_fffffffffffff2c8);
            std::
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff210);
            sVar10 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     ::precedence_level(in_stack_fffffffffffff2c8);
            if ((sVar9 != sVar10) ||
               (bVar3 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        ::is_right_associative(in_stack_fffffffffffff2c8), !bVar3))
            goto LAB_004b716e;
          }
          pvVar7 = std::
                   vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff210);
          puVar13 = (pvVar7->field_2).unary_operator_;
          function_expression::function_expression
                    ((function_expression *)in_stack_fffffffffffff210,
                     (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff208);
          peVar11 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::static_resources::
                    create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
                              (in_stack_fffffffffffff260,
                               (function_expression *)in_stack_fffffffffffff258);
          (*puVar13->_vptr_unary_operator[3])(puVar13,peVar11);
          function_expression::~function_expression
                    ((function_expression *)in_stack_fffffffffffff210);
        }
        local_6c = 2;
      }
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffff220._M_current);
    break;
  case argument:
    unwind_rparen(in_stack_fffffffffffff2d0,
                  (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    break;
  case end_expression_type:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)0x4b62d3);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
    while( true ) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff208);
      bVar3 = false;
      if (bVar2) {
        ptVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffff210);
        tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                type(ptVar5);
        bVar3 = tVar4 != begin_expression_type;
      }
      if (!bVar3) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffff210);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff220._M_current,in_stack_fffffffffffff218._M_current);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff218._M_current);
    bVar3 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff220._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffff218._M_current);
    if (bVar3) {
      local_46a = 1;
      uVar6 = __cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff250,in_stack_fffffffffffff248,in_stack_fffffffffffff240);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error
                ((json_runtime_error<std::runtime_error,_void> *)in_stack_fffffffffffff210,
                 (string *)in_stack_fffffffffffff208);
      local_46a = 0;
      __cxa_throw(uVar6,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    }
    pvVar7 = std::
             vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff210);
    tVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::type
                      (pvVar7);
    if (tVar4 != literal) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff220._M_current,
                 (current_node_arg_t *)in_stack_fffffffffffff218._M_current);
    }
    local_478 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)std::
                   vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::begin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff208);
    local_480 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)std::
                   vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff208);
    std::
    reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
              (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
    local_490 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   ::base(local_438);
    __gnu_cxx::
    __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
    ::
    __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
              ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff210,
               (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff208);
    local_4a0 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)std::
                   vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::end((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff208);
    __gnu_cxx::
    __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
    ::
    __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
              ((__normal_iterator<const_jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff210,
               (__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff208);
    local_4a8 = (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)std::
                   vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::erase(in_stack_fffffffffffff228,in_stack_fffffffffffff238,
                           in_stack_fffffffffffff230);
    function_expression::function_expression
              ((function_expression *)in_stack_fffffffffffff210,
               (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff208);
    jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    static_resources::
    create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
              (in_stack_fffffffffffff260,(function_expression *)in_stack_fffffffffffff258);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )in_stack_fffffffffffff210,
               (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff208);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )in_stack_fffffffffffff210);
    function_expression::~function_expression((function_expression *)in_stack_fffffffffffff210);
    local_6c = 2;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffff220._M_current);
    break;
  case end_of_expression:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::rbegin((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
    while( true ) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::rend((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff218._M_current);
      bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff210,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff208);
      if (!bVar3) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                   *)in_stack_fffffffffffff210);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff210);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::clear((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             *)0x4b731d);
    break;
  case variable:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
    break;
  case variable_binding:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::push_back((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  }
  return;
}

Assistant:

void push_token(token<Json>&& tok, static_resources& resources, 
            std::vector<token<Json>>& output_stack, std::error_code& ec)
        {
            switch (tok.type())
            {
                case token_kind::end_filter:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<token<Json>> toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_filter)
                    {
                        toks.emplace_back(std::move(*it));
                        ++it;
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    if (toks.back().type() != token_kind::literal)
                    {
                        toks.emplace_back(current_node_arg);
                    }
                    std::reverse(toks.begin(), toks.end());
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());

                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(filter_expression(std::move(toks))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(filter_expression(std::move(toks))));
                    }
                    break;
                }
                case token_kind::end_multi_select_list:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<std::vector<token<Json>>> vals;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_list)
                    {
                        std::vector<token<Json>> toks;
                        do
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                        } while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_list && (*it).type() != token_kind::separator);
                        if ((*it).type() == token_kind::separator)
                        {
                            ++it;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        vals.emplace_back(std::move(toks));
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());
                    std::reverse(vals.begin(), vals.end());
                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(multi_select_list(std::move(vals))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(multi_select_list(std::move(vals))));
                    }
                    break;
                }
                case token_kind::end_multi_select_hash:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<key_tokens> key_toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_hash)
                    {
                        std::vector<token<Json>> toks;
                        do
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                        } while (it != output_stack.rend() && (*it).type() != token_kind::key);
                        JSONCONS_ASSERT((*it).is_key());
                        auto key = std::move((*it).key_);
                        ++it;
                        if ((*it).type() == token_kind::separator)
                        {
                            ++it;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        key_toks.emplace_back(std::move(key), std::move(toks));
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    std::reverse(key_toks.begin(), key_toks.end());
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());

                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(multi_select_hash(std::move(key_toks))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(multi_select_hash(std::move(key_toks))));
                    }
                    break;
                }
                case token_kind::end_expression_type:
                {
                    std::vector<token<Json>> toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_expression_type)
                    {
                        toks.emplace_back(std::move(*it));
                        ++it;
                    }
                    if (it == output_stack.rend())
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>("Unbalanced braces"));
                    }
                    if (toks.back().type() != token_kind::literal)
                    {
                        toks.emplace_back(current_node_arg);
                    }
                    std::reverse(toks.begin(), toks.end());
                    output_stack.erase(it.base(),output_stack.end());
                    output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                    break;
                }
                case token_kind::variable:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::variable_binding:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::literal:
                    if (!output_stack.empty() && output_stack.back().type() == token_kind::current_node)
                    {
                        output_stack.back() = std::move(tok);
                    }
                    else
                    {
                        output_stack.push_back(std::move(tok));
                    }
                    break;
                case token_kind::expression:
                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(tok.expression_);
                    }
                    else
                    {
                        output_stack.push_back(std::move(tok));
                    }
                    break;
                case token_kind::rparen:
                    {
                        unwind_rparen(output_stack, ec);
                        break;
                    }
                case token_kind::end_function:
                    {
                        unwind_rparen(output_stack, ec);
                        std::vector<token<Json>> toks;
                        auto it = output_stack.rbegin();
                        std::size_t arg_count = 0;
                        while (it != output_stack.rend() && (*it).type() != token_kind::function)
                        {
                            if ((*it).type() == token_kind::argument)
                            {
                                ++arg_count;
                            }
                            toks.emplace_back(std::move(*it));
                            ++it;
                        }
                        if (it == output_stack.rend())
                        {
                            ec = jmespath_errc::unbalanced_parentheses;
                            return;
                        }
                        if ((*it).arity() && arg_count != *((*it).arity()))
                        {
                            ec = jmespath_errc::invalid_arity;
                            return;
                        }
                        if (arg_count == 0)
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                            output_stack.erase(it.base(), output_stack.end());
                            output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                            break;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        toks.push_back(std::move(*it));
                        ++it;
                        output_stack.erase(it.base(),output_stack.end());

                        if (!output_stack.empty() && output_stack.back().is_projection() && 
                            (tok.precedence_level() < output_stack.back().precedence_level() ||
                            (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                        {
                            output_stack.back().expression_->add_expression(resources.create_expression(function_expression(std::move(toks))));
                        }
                        else
                        {
                            output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                        }
                        break;
                    }
                case token_kind::end_of_expression:
                    {
                        auto it = operator_stack_.rbegin();
                        while (it != operator_stack_.rend())
                        {
                            output_stack.push_back(std::move(*it));
                            ++it;
                        }
                        operator_stack_.clear();
                        break;
                    }
                case token_kind::unary_operator:
                case token_kind::binary_operator:
                {
                    if (operator_stack_.empty() || operator_stack_.back().is_lparen())
                    {
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    else if (tok.precedence_level() < operator_stack_.back().precedence_level()
                             || (tok.precedence_level() == operator_stack_.back().precedence_level() && tok.is_right_associative()))
                    {
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    else
                    {
                        auto it = operator_stack_.rbegin();
                        while (it != operator_stack_.rend() && (*it).is_operator()
                               && (tok.precedence_level() > (*it).precedence_level()
                             || (tok.precedence_level() == (*it).precedence_level() && tok.is_right_associative())))
                        {
                            output_stack.push_back(std::move(*it));
                            ++it;
                        }

                        operator_stack_.erase(it.base(),operator_stack_.end());
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    break;
                }
                case token_kind::separator:
                {
                    unwind_rparen(output_stack, ec);
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                }
                case token_kind::begin_filter:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::begin_multi_select_list:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::begin_multi_select_hash:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::function:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::current_node:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::key:
                case token_kind::pipe:
                case token_kind::begin_expression_type:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::argument:
                    unwind_rparen(output_stack, ec);
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::lparen:
                    operator_stack_.emplace_back(std::move(tok));
                    break;
                default:
                    break;
            }
        }